

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O0

int __thiscall
axl::sl::
ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
::remove(ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
         *this,char *__filename)

{
  ListLink *pLVar1;
  Link *pLVar2;
  Entry *pEVar3;
  ListLink *prev;
  ListLink *next;
  ListLink *link;
  IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
  *in_stack_ffffffffffffffe0;
  Link *p;
  IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
  local_8;
  
  local_8.m_p = (Entry *)__filename;
  pLVar2 = IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
           ::getLink(in_stack_ffffffffffffffe0);
  p = pLVar2->m_next;
  pLVar1 = pLVar2->m_prev;
  if (pLVar1 == (ListLink *)0x0) {
    pEVar3 = IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
             ::getEntryFromLink(p);
    (this->super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>).m_head = pEVar3;
  }
  else {
    pLVar1->m_next = p;
  }
  if (p == (Link *)0x0) {
    pEVar3 = IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
             ::getEntryFromLink((Link *)0x0);
    (this->super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>).m_tail = pEVar3;
  }
  else {
    p->m_prev = pLVar1;
  }
  (this->super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>).m_count =
       (this->super_ListData<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>_>).m_count - 1;
  pEVar3 = IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
           ::getEntry(&local_8);
  return (int)pEVar3;
}

Assistant:

T*
	remove(Iterator it) {
		ASSERT(!isEmpty());

		ListLink* link = it.getLink();
		ListLink* next = link->m_next;
		ListLink* prev = link->m_prev;

		if (prev)
			prev->m_next = next;
		else
			this->m_head = Iterator::getEntryFromLink(next);

		if (next)
			next->m_prev = prev;
		else
			this->m_tail = Iterator::getEntryFromLink(prev);

		this->m_count--;
		return it.getEntry();
	}